

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

CharClass * __thiscall duckdb_re2::CharClassBuilder::GetCharClass(CharClassBuilder *this)

{
  bool bVar1;
  CharClass CVar2;
  reference pRVar3;
  CharClassBuilder *in_RDI;
  iterator it;
  int n;
  CharClass *cc;
  CharClassBuilder *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  int local_14;
  CharClass *local_10;
  
  std::set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
  ::size((set<duckdb_re2::RuneRange,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
          *)0x2600e5c);
  local_10 = CharClass::New((size_t)in_RDI);
  local_14 = 0;
  local_20._M_node = (_Base_ptr)begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_28._M_node = (_Base_ptr)end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pRVar3 = std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator*
                       ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)0x2600eae);
    *(RuneRange *)(*(long *)(local_10 + 8) + (long)local_14 * 8) = *pRVar3;
    local_14 = local_14 + 1;
    std::_Rb_tree_const_iterator<duckdb_re2::RuneRange>::operator++
              ((_Rb_tree_const_iterator<duckdb_re2::RuneRange> *)in_RDI);
  }
  *(int *)(local_10 + 0x10) = local_14;
  *(int *)(local_10 + 4) = in_RDI->nrunes_;
  CVar2 = (CharClass)FoldsASCII(in_RDI);
  *local_10 = CVar2;
  return local_10;
}

Assistant:

CharClass* CharClassBuilder::GetCharClass() {
  CharClass* cc = CharClass::New(ranges_.size());
  int n = 0;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_[n++] = *it;
  cc->nranges_ = n;
  DCHECK_LE(n, static_cast<int>(ranges_.size()));
  cc->nrunes_ = nrunes_;
  cc->folds_ascii_ = FoldsASCII();
  return cc;
}